

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  pointer pcVar5;
  cmMakefile *pcVar6;
  cmake *pcVar7;
  pointer pcVar8;
  ostream *poVar9;
  PolicyID id;
  PolicyID id_00;
  LocalGeneratorVector *this_00;
  float local_594;
  allocator<char> local_539;
  string local_538;
  cmListFileBacktrace local_518;
  string local_500;
  reference local_4e0;
  string *t_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  undefined1 local_4a0 [8];
  ostringstream w_1;
  cmListFileBacktrace local_328;
  string local_310;
  reference local_2f0;
  string *t;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_2b0 [8];
  ostringstream w;
  cmListFileBacktrace local_138;
  allocator<char> local_119;
  string local_118;
  reference local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>
  *buildExpSet;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
  *__range1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  uint local_48;
  uint i;
  allocator<char> local_31;
  string local_30;
  cmGlobalGenerator *local_10;
  cmGlobalGenerator *this_local;
  
  local_10 = this;
  (*this->_vptr_cmGlobalGenerator[0x3d])();
  ProcessEvaluationFiles(this);
  pcVar7 = this->CMakeInstance;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Generating",&local_31);
  cmake::UpdateProgress(pcVar7,&local_30,0.1);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; uVar2 = (ulong)local_48,
      sVar3 = std::
              vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
              ::size(&this->LocalGenerators), uVar2 < sVar3; local_48 = local_48 + 1) {
    this_00 = &this->LocalGenerators;
    pvVar4 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::operator[](this_00,(ulong)local_48);
    pcVar5 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (pvVar4);
    pcVar6 = cmLocalGenerator::GetMakefile(pcVar5);
    SetCurrentMakefile(this,pcVar6);
    pvVar4 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::operator[](this_00,(ulong)local_48);
    pcVar5 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (pvVar4);
    (*pcVar5->_vptr_cmLocalGenerator[2])();
    pvVar4 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::operator[](this_00,(ulong)local_48);
    pcVar5 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (pvVar4);
    pcVar6 = cmLocalGenerator::GetMakefile(pcVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"CMAKE_SKIP_INSTALL_RULES",&local_69);
    bVar1 = cmMakefile::IsOn(pcVar6,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar4 = std::
               vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ::operator[](&this->LocalGenerators,(ulong)local_48);
      pcVar5 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                         (pvVar4);
      cmLocalGenerator::GenerateInstallRules(pcVar5);
    }
    pvVar4 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::operator[](&this->LocalGenerators,(ulong)local_48);
    pcVar5 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (pvVar4);
    cmLocalGenerator::GenerateTestFiles(pcVar5);
    pcVar7 = this->CMakeInstance;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Generating",&local_91);
    uVar2 = (ulong)local_48;
    sVar3 = std::
            vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ::size(&this->LocalGenerators);
    local_594 = (float)sVar3;
    cmake::UpdateProgress(pcVar7,&local_90,(((float)uVar2 + 1.0) * 0.9) / local_594 + 0.1);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  SetCurrentMakefile(this,(cmMakefile *)0x0);
  bVar1 = GenerateCPackPropertiesFile(this);
  if (!bVar1) {
    pcVar7 = GetCMakeInstance(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Could not write CPack properties file.",&local_b9);
    __range1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
                *)0x0;
    _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&__range1);
    cmake::IssueMessage(pcVar7,FATAL_ERROR,&local_b8,(cmListFileBacktrace *)&__range1);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__range1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
           ::begin(&this->BuildExportSets);
  buildExpSet = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
                   ::end(&this->BuildExportSets);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&buildExpSet);
    if (!bVar1) {
      CheckRuleHashes(this);
      WriteSummary(this);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->ExtraGenerator);
      if (bVar1) {
        pcVar8 = std::
                 unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                 ::operator->(&this->ExtraGenerator);
        (*pcVar8->_vptr_cmExternalMakefileProjectGenerator[4])();
      }
      CheckTargetLinkLibraries(this);
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->CMP0042WarnTargets);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&__range2,(cmPolicies *)0x2a,id);
        poVar9 = std::operator<<((ostream *)local_2b0,(string *)&__range2);
        std::operator<<(poVar9,"\n");
        std::__cxx11::string::~string((string *)&__range2);
        std::operator<<((ostream *)local_2b0,
                        "MACOSX_RPATH is not specified for the following targets:\n");
        __end2 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->CMP0042WarnTargets);
        t = (string *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->CMP0042WarnTargets);
        while (bVar1 = std::operator!=(&__end2,(_Self *)&t), bVar1) {
          local_2f0 = std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end2);
          poVar9 = std::operator<<((ostream *)local_2b0," ");
          poVar9 = std::operator<<(poVar9,(string *)local_2f0);
          std::operator<<(poVar9,"\n");
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2);
        }
        pcVar7 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        local_328.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_328.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmListFileBacktrace::cmListFileBacktrace(&local_328);
        cmake::IssueMessage(pcVar7,AUTHOR_WARNING,&local_310,&local_328);
        cmListFileBacktrace::~cmListFileBacktrace(&local_328);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
      }
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->CMP0068WarnTargets);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a0);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&__range2_1,(cmPolicies *)0x44,id_00);
        poVar9 = std::operator<<((ostream *)local_4a0,(string *)&__range2_1);
        std::operator<<(poVar9,
                        "\nFor compatibility with older versions of CMake, the install_name fields for the following targets are still affected by RPATH settings:\n"
                       );
        std::__cxx11::string::~string((string *)&__range2_1);
        __end2_1 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->CMP0068WarnTargets);
        t_1 = (string *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->CMP0068WarnTargets);
        while (bVar1 = std::operator!=(&__end2_1,(_Self *)&t_1), bVar1) {
          local_4e0 = std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end2_1);
          poVar9 = std::operator<<((ostream *)local_4a0," ");
          poVar9 = std::operator<<(poVar9,(string *)local_4e0);
          std::operator<<(poVar9,"\n");
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2_1);
        }
        pcVar7 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        local_518.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_518.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmListFileBacktrace::cmListFileBacktrace(&local_518);
        cmake::IssueMessage(pcVar7,AUTHOR_WARNING,&local_500,&local_518);
        cmListFileBacktrace::~cmListFileBacktrace(&local_518);
        std::__cxx11::string::~string((string *)&local_500);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a0);
      }
      pcVar7 = this->CMakeInstance;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_538,"Generating done",&local_539);
      cmake::UpdateProgress(pcVar7,&local_538,-1.0);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator(&local_539);
      return;
    }
    local_f8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
               ::operator*(&__end1);
    bVar1 = cmExportFileGenerator::GenerateImportFile
                      (&local_f8->second->super_cmExportFileGenerator);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
    ::operator++(&__end1);
  }
  bVar1 = cmSystemTools::GetErrorOccurredFlag();
  if (bVar1) {
    return;
  }
  pcVar7 = GetCMakeInstance(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Could not write export file.",&local_119);
  local_138.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_138.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmListFileBacktrace::cmListFileBacktrace(&local_138);
  cmake::IssueMessage(pcVar7,FATAL_ERROR,&local_118,&local_138);
  cmListFileBacktrace::~cmListFileBacktrace(&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  return;
}

Assistant:

void cmGlobalGenerator::Generate()
{
  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->InitializeProgressMarks();

  this->ProcessEvaluationFiles();

  this->CMakeInstance->UpdateProgress("Generating", 0.1f);

  // Generate project files
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if (!this->LocalGenerators[i]->GetMakefile()->IsOn(
          "CMAKE_SKIP_INSTALL_RULES")) {
      this->LocalGenerators[i]->GenerateInstallRules();
    }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress(
      "Generating",
      0.1f +
        0.9f * (static_cast<float>(i) + 1.0f) /
          static_cast<float>(this->LocalGenerators.size()));
  }
  this->SetCurrentMakefile(nullptr);

  if (!this->GenerateCPackPropertiesFile()) {
    this->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, "Could not write CPack properties file.");
  }

  for (auto& buildExpSet : this->BuildExportSets) {
    if (!buildExpSet.second->GenerateImportFile()) {
      if (!cmSystemTools::GetErrorOccurredFlag()) {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               "Could not write export file.");
      }
      return;
    }
  }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator) {
    this->ExtraGenerator->Generate();
  }

  // Perform validation checks on memoized link structures.
  this->CheckTargetLinkLibraries();

  if (!this->CMP0042WarnTargets.empty()) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for (std::string const& t : this->CMP0042WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  if (!this->CMP0068WarnTargets.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0068) << "\n"
      "For compatibility with older versions of CMake, the install_name "
      "fields for the following targets are still affected by RPATH "
      "settings:\n"
      ;
    /* clang-format on */
    for (std::string const& t : this->CMP0068WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  this->CMakeInstance->UpdateProgress("Generating done", -1);
}